

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_stream_socket.c
# Opt level: O2

int log_policy_stream_socket_write(log_policy policy,void *buffer,size_t size)

{
  log_policy_instance(policy);
  return 0;
}

Assistant:

static int log_policy_stream_socket_write(log_policy policy, const void *buffer, const size_t size)
{
	log_policy_stream_socket_data socket_data = log_policy_instance(policy);

	/* TODO: write to socket */
	(void)socket_data;
	(void)buffer;
	(void)size;

	return 0;
}